

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void apu_synchronize(Emulator *e)

{
  u8 *puVar1;
  Ticks *pTVar2;
  int *piVar3;
  u8 uVar4;
  SweepDirection SVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  short sVar12;
  u32 uVar13;
  ulong uVar14;
  ushort uVar15;
  uint uVar16;
  u32 uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  byte bVar25;
  byte bVar26;
  u32 total_frames;
  int iVar27;
  ushort uVar28;
  bool bVar29;
  int local_48;
  
  uVar10 = (e->state).ticks;
  uVar14 = (e->state).apu.sync_ticks;
  if (uVar14 < uVar10) {
    iVar7 = (int)uVar10;
    iVar27 = (int)uVar14;
    uVar22 = iVar7 - iVar27;
    if ((e->state).apu.enabled == FALSE) {
      if (uVar22 != 0) {
        iVar27 = iVar27 - iVar7;
        do {
          write_audio_frame(e,1);
          iVar27 = iVar27 + 2;
        } while (iVar27 != 0);
      }
      (e->state).apu.sync_ticks = (e->state).ticks;
    }
    else {
      if (uVar22 != 0) {
        do {
          uVar10 = (e->state).apu.sync_ticks;
          if ((uVar10 & 0x1fff) == 0) {
            bVar9 = (e->state).apu.frame + 1 & 7;
            (e->state).apu.frame = bVar9;
            switch(bVar9) {
            case 2:
            case 6:
              if (((e->state).apu.channel[0].status != FALSE) &&
                 ((e->state).apu.sweep.enabled != FALSE)) {
                uVar4 = (e->state).apu.sweep.period;
                puVar1 = &(e->state).apu.sweep.timer;
                *puVar1 = *puVar1 + 0xff;
                if (*puVar1 == '\0') {
                  if (uVar4 == '\0') {
                    (e->state).apu.sweep.timer = '\b';
                  }
                  else {
                    (e->state).apu.sweep.timer = uVar4;
                    uVar15 = (e->state).apu.sweep.frequency;
                    SVar5 = (e->state).apu.sweep.direction;
                    if (SVar5 == SWEEP_DIRECTION_ADDITION) {
                      uVar6 = uVar15 >> ((e->state).apu.sweep.shift & 0x1f);
                    }
                    else {
                      (e->state).apu.sweep.calculated_subtract = TRUE;
                      uVar6 = -(uVar15 >> ((e->state).apu.sweep.shift & 0x1f));
                    }
                    uVar15 = uVar15 + uVar6;
                    if (uVar15 < 0x800) {
                      bVar9 = (e->state).apu.sweep.shift;
                      if (bVar9 != 0) {
                        (e->state).apu.channel[0].frequency = uVar15;
                        (e->state).apu.sweep.frequency = uVar15;
                        (e->state).apu.channel[0].square_wave.period =
                             (uint)(ushort)(uVar15 * -4 + 0x2000);
                      }
                      uVar15 = (e->state).apu.sweep.frequency;
                      if (SVar5 == SWEEP_DIRECTION_ADDITION) {
                        uVar6 = uVar15 >> (bVar9 & 0x1f);
                      }
                      else {
                        (e->state).apu.sweep.calculated_subtract = TRUE;
                        uVar6 = -(uVar15 >> (bVar9 & 0x1f));
                      }
                      if ((ushort)(uVar15 + uVar6) < 0x800) goto switchD_00105e5a_caseD_0;
                    }
                    (e->state).apu.channel[0].status = FALSE;
                  }
                }
              }
            case 0:
            case 4:
switchD_00105e5a_caseD_0:
              lVar11 = 0;
              do {
                if (((*(int *)((long)&(e->state).apu.channel[0].length_enabled + lVar11) != 0) &&
                    (sVar12 = *(short *)((long)&(e->state).apu.channel[0].length + lVar11),
                    sVar12 != 0)) &&
                   (sVar12 = sVar12 + -1,
                   *(short *)((long)&(e->state).apu.channel[0].length + lVar11) = sVar12,
                   sVar12 == 0)) {
                  *(undefined4 *)((long)&(e->state).apu.channel[0].status + lVar11) = 0;
                }
                lVar11 = lVar11 + 0x40;
              } while (lVar11 != 0x100);
              break;
            case 7:
              lVar11 = 0;
              do {
                bVar9 = (&(e->state).apu.channel[0].envelope.period)[lVar11];
                if (bVar9 == 0) {
                  *(undefined4 *)((long)&(e->state).apu.channel[0].envelope.timer + lVar11) = 8;
                }
                else if (*(int *)((long)&(e->state).apu.channel[0].envelope.automatic + lVar11) != 0
                        ) {
                  piVar3 = (int *)((long)&(e->state).apu.channel[0].envelope.timer + lVar11);
                  *piVar3 = *piVar3 + -1;
                  if (*piVar3 == 0) {
                    *(uint *)((long)&(e->state).apu.channel[0].envelope.timer + lVar11) =
                         (uint)bVar9;
                    bVar9 = (-(*(int *)((long)&(e->state).apu.channel[0].envelope.direction + lVar11
                                       ) == 0) | 1U) +
                            (&(e->state).apu.channel[0].envelope.volume)[lVar11];
                    if (bVar9 < 0xf) {
                      (&(e->state).apu.channel[0].envelope.volume)[lVar11] = bVar9;
                    }
                    else {
                      *(undefined4 *)((long)&(e->state).apu.channel[0].envelope.automatic + lVar11)
                           = 0;
                    }
                  }
                }
                lVar11 = lVar11 + 0x40;
              } while (lVar11 != 0x100);
            }
          }
          uVar10 = 0x2000 - (ulong)((uint)uVar10 & 0x1fff);
          if (uVar22 <= uVar10) {
            uVar10 = (ulong)uVar22;
          }
          if (1 < uVar10) {
            uVar14 = uVar10 >> 1 & 0x7fffffff;
            do {
              uVar8 = (e->audio_buffer).freq_counter;
              uVar18 = 0;
              if (uVar8 < 0x200000) {
                uVar18 = 0;
                do {
                  uVar8 = uVar8 + (e->audio_buffer).frequency;
                  uVar18 = (ulong)((int)uVar18 + 1);
                } while (uVar8 < 0x200000);
              }
              uVar8 = (uint)uVar18;
              uVar20 = uVar14;
              if (uVar8 < (uint)uVar14) {
                uVar20 = uVar18;
              }
              total_frames = (u32)uVar20;
              update_square_wave((e->state).apu.channel,total_frames);
              update_square_wave((e->state).apu.channel + 1,total_frames);
              if ((uVar8 != 0) && ((e->state).apu.channel[2].status != FALSE)) {
                iVar7 = (int)(e->state).apu.sync_ticks;
                bVar9 = (e->state).apu.wave.volume_shift;
                uVar19 = (e->state).apu.wave.ticks;
                bVar25 = (e->state).apu.wave.sample_data;
                uVar13 = (e->state).apu.channel[2].accumulator;
                uVar18 = uVar20;
                do {
                  uVar24 = uVar19 >> 1;
                  bVar23 = bVar25 >> (bVar9 & 0x1f);
                  uVar16 = (uint)uVar18;
                  if (uVar16 < uVar24) {
                    uVar19 = uVar19 + uVar16 * -2;
                    uVar24 = uVar16;
                  }
                  else {
                    bVar21 = (e->state).apu.wave.position + 1;
                    bVar25 = bVar21 & 0x1f;
                    (e->state).apu.wave.position = bVar25;
                    (e->state).apu.wave.sample_time = (ulong)(uVar19 + iVar7);
                    bVar26 = (e->state).apu.wave.ram[bVar25 >> 1];
                    bVar25 = bVar26 & 0xf;
                    if ((bVar21 & 1) == 0) {
                      bVar25 = bVar26 >> 4;
                    }
                    (e->state).apu.wave.sample_data = bVar25;
                    uVar19 = (e->state).apu.wave.period;
                  }
                  iVar7 = iVar7 + uVar24 * 2;
                  uVar13 = uVar13 + bVar23 * uVar24;
                  uVar18 = (ulong)(uVar16 - uVar24);
                } while (uVar16 - uVar24 != 0);
                (e->state).apu.wave.ticks = uVar19;
                (e->state).apu.channel[2].accumulator = uVar13;
              }
              if ((uVar8 != 0) && ((e->state).apu.channel[3].status != FALSE)) {
                bVar9 = (e->state).apu.channel[3].envelope.volume;
                bVar25 = (e->state).apu.noise.clock_shift;
                uVar13 = (e->state).apu.noise.ticks;
                uVar17 = (e->state).apu.channel[3].accumulator;
                bVar23 = (e->state).apu.noise.sample;
                do {
                  uVar19 = (uint)uVar20;
                  bVar26 = bVar23;
                  uVar8 = uVar19;
                  if (bVar25 < 0xe) {
                    uVar8 = uVar13 >> 1;
                    if (uVar19 < uVar8) {
                      uVar13 = uVar13 + uVar19 * -2;
                      uVar8 = uVar19;
                    }
                    else {
                      uVar15 = (e->state).apu.noise.lfsr;
                      uVar6 = uVar15 >> 1;
                      uVar13 = (e->state).apu.noise.period;
                      bVar29 = (e->state).apu.noise.lfsr_width != LFSR_WIDTH_7;
                      uVar28 = 0x3fff;
                      if (!bVar29) {
                        uVar28 = 0x7fbf;
                      }
                      (e->state).apu.noise.lfsr =
                           (ushort)(((uVar15 ^ uVar6) & 1) << (bVar29 << 3 | 6U)) | uVar28 & uVar6;
                      bVar26 = ~(byte)uVar6 & 1;
                      (e->state).apu.noise.sample = bVar26;
                    }
                    (e->state).apu.noise.ticks = uVar13;
                  }
                  uVar17 = uVar17 + (-bVar23 & bVar9) * uVar8;
                  uVar20 = (ulong)(uVar19 - uVar8);
                  bVar23 = bVar26;
                } while (uVar19 - uVar8 != 0);
                (e->state).apu.channel[3].accumulator = uVar17;
              }
              write_audio_frame(e,total_frames);
              pTVar2 = &(e->state).apu.sync_ticks;
              *pTVar2 = *pTVar2 + (ulong)(total_frames * 2);
              uVar8 = (uint)uVar14 - total_frames;
              uVar14 = (ulong)uVar8;
            } while (uVar8 != 0);
          }
          local_48 = (int)uVar10;
          uVar22 = uVar22 - local_48;
        } while (uVar22 != 0);
      }
      if ((e->state).apu.sync_ticks != (e->state).ticks) {
        __assert_fail("APU.sync_ticks == TICKS",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                      ,0xf64,"void apu_synchronize(Emulator *)");
      }
    }
  }
  return;
}

Assistant:

static void apu_synchronize(Emulator* e) {
  if (TICKS > APU.sync_ticks) {
    u32 ticks = TICKS - APU.sync_ticks;
    if (APU.enabled) {
      apu_update(e, ticks);
      assert(APU.sync_ticks == TICKS);
    } else {
      for (; ticks; ticks -= APU_TICKS) {
        write_audio_frame(e, 1);
      }
      APU.sync_ticks = TICKS;
    }
  }
}